

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_GetIssuanceBlindingKey_Test::TestBody
          (cfdcapi_elements_transaction_GetIssuanceBlindingKey_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  char **in_stack_00000018;
  uint32_t in_stack_00000024;
  char *in_stack_00000028;
  char *in_stack_00000030;
  void *in_stack_00000038;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *str_buffer;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *blinding_key;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffdf8;
  AssertionResult *in_stack_fffffffffffffe00;
  CfdErrorCode *in_stack_fffffffffffffe08;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  void **in_stack_fffffffffffffe18;
  void *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe98;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  char *local_f0;
  AssertHelper local_e8;
  Message local_e0;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffe18);
  local_2c = 0;
  pAVar4 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe18,
             (char *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x353b8a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x2ef,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x353bed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x353c42);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(type *)0x353c76);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x2f0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x353d72);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x353ded);
  local_a0 = (char *)0x0;
  local_14 = CfdGetIssuanceBlindingKey
                       (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000024,
                        in_stack_00000018);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe18,
             (char *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x353ec9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x2f7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x353f26);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x353f7b);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_d8,
               "\"7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f\"","blinding_key"
               ,"7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f",local_a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar2) {
      testing::Message::Message(&local_e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x35401e);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x2f9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::Message::~Message((Message *)0x35407b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3540d0);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffe08);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffe38);
  if (local_14 != 0) {
    local_f0 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(uVar1,in_stack_fffffffffffffe98),(char **)pAVar4);
    local_104 = 0;
    pAVar4 = &local_100;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffe18,
               (char *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar2) {
      testing::Message::Message(&local_110);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3541ca);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x302,pcVar3);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message((Message *)0x354227);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x35427c);
    testing::internal::CmpHelperSTREQ((internal *)&local_128,"\"\"","str_buffer","",local_f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar2) {
      testing::Message::Message(&local_130);
      in_stack_fffffffffffffe18 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x354311);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x303,(char *)in_stack_fffffffffffffe18);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x35436e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3543c3);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffe08);
    local_f0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffe08);
  local_14c = 0;
  pAVar4 = &local_148;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe18,
             (char *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffe00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x354493);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x309,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x3544f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x354545);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, GetIssuanceBlindingKey) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* blinding_key = nullptr;
  ret = CfdGetIssuanceBlindingKey(
    handle, "ac2c1e4cce122139bb25abc50599e09738143cc4bc96e55f399a5e1e45d916a9",
    "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 1,
    &blinding_key);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f", blinding_key);

    CfdFreeStringBuffer(blinding_key);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}